

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void format(tagval *args,int numargs)

{
  char cVar1;
  char *pcVar2;
  char *local_70;
  char local_53;
  char local_52;
  char local_51;
  char *local_50;
  char *sub;
  int local_40;
  int i;
  int c;
  char *local_30;
  char *f;
  vector<char> s;
  int numargs_local;
  tagval *args_local;
  
  s.ulen = numargs;
  vector<char>::vector((vector<char> *)&f);
  local_30 = tagval::getstr(args);
  while (*local_30 != '\0') {
    pcVar2 = local_30 + 1;
    local_40 = (int)*local_30;
    if (local_40 == 0x25) {
      local_30 = local_30 + 2;
      cVar1 = *pcVar2;
      sub._4_4_ = (int)cVar1;
      if ((sub._4_4_ < 0x31) || (0x39 < sub._4_4_)) {
        local_51 = cVar1;
        vector<char>::add((vector<char> *)&f,&local_51);
      }
      else {
        sub._4_4_ = sub._4_4_ + -0x30;
        if (sub._4_4_ < s.ulen) {
          local_70 = tagval::getstr(args + sub._4_4_);
        }
        else {
          local_70 = "";
        }
        local_50 = local_70;
        while (pcVar2 = local_50, *local_50 != '\0') {
          local_50 = local_50 + 1;
          vector<char>::add((vector<char> *)&f,pcVar2);
        }
      }
    }
    else {
      local_52 = *local_30;
      local_30 = pcVar2;
      vector<char>::add((vector<char> *)&f,&local_52);
    }
  }
  local_53 = '\0';
  vector<char>::add((vector<char> *)&f,&local_53);
  pcVar2 = vector<char>::getbuf((vector<char> *)&f);
  result(pcVar2);
  vector<char>::~vector((vector<char> *)&f);
  return;
}

Assistant:

void format(tagval *args, int numargs)
{
    vector<char> s;
    const char *f = args[0].getstr();
    while(*f)
    {
        int c = *f++;
        if(c == '%')
        {
            int i = *f++;
            if(i >= '1' && i <= '9')
            {
                i -= '0';
                const char *sub = i < numargs ? args[i].getstr() : "";
                while(*sub) s.add(*sub++);
            }
            else s.add(i);
        }
        else s.add(c);
    }
    s.add('\0');
    result(s.getbuf());
}